

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O0

Vec_Vec_t *
Ssw_ManFindDirectImplications(Aig_Man_t *p,int nFrames,int nConfs,int nProps,int fVerbose)

{
  Aig_Obj_t *p_00;
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Vec_t *p_01;
  Aig_Man_t *p_02;
  Cnf_Dat_t *p_03;
  sat_solver *s;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  uint local_6c;
  int value;
  int k;
  int f;
  int i;
  Aig_Obj_t *pReprR;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj;
  Aig_Man_t *pFrames;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Vec_Ptr_t *vNodes;
  Vec_Vec_t *vCands;
  int fVerbose_local;
  int nProps_local;
  int nConfs_local;
  int nFrames_local;
  Aig_Man_t *p_local;
  
  p_01 = Vec_VecAlloc(nFrames);
  p_02 = Saig_ManUnrollCOI(p,nFrames);
  iVar2 = Aig_ManCoNum(p_02);
  if (iVar2 == 1) {
    p_03 = Cnf_DeriveSimple(p_02,0);
    s = (sat_solver *)Cnf_DataWriteIntoSolver(p_03,1,0);
    if (s != (sat_solver *)0x0) {
      Aig_ManIncrementTravId(p);
      for (value = 0; value < nFrames; value = value + 1) {
        for (k = 0; iVar2 = Vec_PtrSize(p->vObjs), k < iVar2; k = k + 1) {
          pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,k);
          if (((pAVar5 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsCand(pAVar5), iVar2 != 0)) &&
             (iVar2 = Aig_ObjIsTravIdCurrent(p,pAVar5), iVar2 == 0)) {
            p_00 = p->pObjCopies[(nFrames * k + nFrames + -1) - value];
            pAVar6 = Aig_Regular(p_00);
            piVar1 = p_03->pVarNums;
            iVar2 = Aig_ObjId(pAVar6);
            if (-1 < piVar1[iVar2]) {
              piVar1 = p_03->pVarNums;
              iVar2 = Aig_ObjId(pAVar6);
              iVar2 = sat_solver_get_var_value(s,piVar1[iVar2]);
              if (iVar2 != 0) {
                Aig_ObjSetTravIdCurrent(p,pAVar5);
                iVar3 = Saig_ObjIsLo(p,pAVar5);
                if (iVar3 != 0) {
                  pAVar6 = Saig_ObjLoToLi(p,pAVar5);
                  pAVar6 = Aig_ObjFanin0(pAVar6);
                  Aig_ObjSetTravIdCurrent(p,pAVar6);
                }
                uVar4 = Aig_IsComplement(p_00);
                pAVar5 = Aig_NotCond(pAVar5,iVar2 == 1 ^ uVar4);
                Vec_VecPush(p_01,value,pAVar5);
              }
            }
          }
        }
      }
      sat_solver_delete(s);
    }
    Aig_ManStop(p_02);
    Cnf_DataFree(p_03);
    if (fVerbose != 0) {
      uVar4 = Vec_VecSizeSize(p_01);
      printf("Found %3d candidates.\n",(ulong)uVar4);
      for (local_6c = 0; iVar2 = Vec_VecSize(p_01), (int)local_6c < iVar2; local_6c = local_6c + 1)
      {
        pVVar7 = Vec_VecEntry(p_01,local_6c);
        uVar4 = Vec_PtrSize(pVVar7);
        printf("Level %d. Cands  =%d    ",(ulong)local_6c,(ulong)uVar4);
        printf("\n");
      }
    }
    if (p->pObjCopies != (Aig_Obj_t **)0x0) {
      free(p->pObjCopies);
      p->pObjCopies = (Aig_Obj_t **)0x0;
    }
    Saig_ManFilterUsingInd(p,p_01,nConfs,nProps,fVerbose);
    iVar2 = Vec_VecSizeSize(p_01);
    if (iVar2 != 0) {
      uVar4 = Vec_VecSizeSize(p_01);
      printf("Found %3d constraints after filtering.\n",(ulong)uVar4);
    }
    if (fVerbose != 0) {
      for (local_6c = 0; iVar2 = Vec_VecSize(p_01), (int)local_6c < iVar2; local_6c = local_6c + 1)
      {
        pVVar7 = Vec_VecEntry(p_01,local_6c);
        uVar4 = Vec_PtrSize(pVVar7);
        printf("Level %d. Constr =%d    ",(ulong)local_6c,(ulong)uVar4);
        printf("\n");
      }
    }
    return p_01;
  }
  __assert_fail("Aig_ManCoNum(pFrames) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigConstr2.c"
                ,0x244,"Vec_Vec_t *Ssw_ManFindDirectImplications(Aig_Man_t *, int, int, int, int)");
}

Assistant:

Vec_Vec_t * Ssw_ManFindDirectImplications( Aig_Man_t * p, int nFrames, int nConfs, int nProps, int fVerbose )
{
    Vec_Vec_t * vCands = NULL;
    Vec_Ptr_t * vNodes;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pRepr, * pReprR;
    int i, f, k, value;
    vCands = Vec_VecAlloc( nFrames );

    // perform unrolling
    pFrames = Saig_ManUnrollCOI( p, nFrames );
    assert( Aig_ManCoNum(pFrames) == 1 );
    // start the SAT solver
    pCnf = Cnf_DeriveSimple( pFrames, 0 );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat != NULL )
    {
        Aig_ManIncrementTravId( p );
        for ( f = 0; f < nFrames; f++ )
        {
            Aig_ManForEachObj( p, pObj, i )
            {
                if ( !Aig_ObjIsCand(pObj) )
                    continue;
                if ( Aig_ObjIsTravIdCurrent(p, pObj) )
                    continue;
                // get the node from timeframes
                pRepr  = p->pObjCopies[nFrames*i + nFrames-1-f];
                pReprR = Aig_Regular(pRepr);
                if ( pCnf->pVarNums[Aig_ObjId(pReprR)] < 0 )
                    continue;
//                value = pSat->assigns[ pCnf->pVarNums[Aig_ObjId(pReprR)] ];
                value = sat_solver_get_var_value( pSat, pCnf->pVarNums[Aig_ObjId(pReprR)] );
                if ( value == l_Undef )
                    continue;
                // label this node as taken
                Aig_ObjSetTravIdCurrent(p, pObj);
                if ( Saig_ObjIsLo(p, pObj) )
                    Aig_ObjSetTravIdCurrent( p, Aig_ObjFanin0(Saig_ObjLoToLi(p, pObj)) );
                // remember the node
                Vec_VecPush( vCands, f, Aig_NotCond( pObj, (value == l_True) ^ Aig_IsComplement(pRepr) ) );
        //        printf( "%s%d ", (value == l_False)? "":"!", i );
            }
        }
    //    printf( "\n" );
        sat_solver_delete( pSat );
    }
    Aig_ManStop( pFrames );
    Cnf_DataFree( pCnf );

    if ( fVerbose )
    {
        printf( "Found %3d candidates.\n", Vec_VecSizeSize(vCands) );
        Vec_VecForEachLevel( vCands, vNodes, k )
        {
            printf( "Level %d. Cands  =%d    ", k, Vec_PtrSize(vNodes) );
//            Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
//                printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
            printf( "\n" );
        }
    }

    ABC_FREE( p->pObjCopies );
    Saig_ManFilterUsingInd( p, vCands, nConfs, nProps, fVerbose );
    if ( Vec_VecSizeSize(vCands) )
        printf( "Found %3d constraints after filtering.\n", Vec_VecSizeSize(vCands) );
    if ( fVerbose )
    {
        Vec_VecForEachLevel( vCands, vNodes, k )
        {
            printf( "Level %d. Constr =%d    ", k, Vec_PtrSize(vNodes) );
//            Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
//                printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
            printf( "\n" );
        }
    }

    return vCands;
}